

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::ProcessorBase::ProcessorBase
          (ProcessorBase *this,ObjectType ot,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  SourceCodeText *pSVar1;
  char *pcVar2;
  SourceCodeText *pSVar3;
  Scope *pSVar4;
  
  pSVar1 = (processorKeyword->sourceCode).object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pcVar2 = (processorKeyword->location).data;
  (this->super_ModuleBase).super_ASTObject.objectType = ot;
  pSVar3 = (processorName->location).sourceCode.object;
  (this->super_ModuleBase).super_ASTObject.context.location.sourceCode.object = pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  (this->super_ModuleBase).super_ASTObject.context.location.location.data =
       (processorName->location).location.data;
  pSVar4 = processorName->parentScope;
  (this->super_ModuleBase).super_ASTObject.context.parentScope = pSVar4;
  (this->super_ModuleBase).processorKeywordLocation.sourceCode.object = pSVar1;
  (this->super_ModuleBase).processorKeywordLocation.location.data = pcVar2;
  (this->super_ModuleBase).name.name = moduleName.name;
  (this->super_ModuleBase).isFullyResolved = false;
  memset(&(this->super_ModuleBase).specialisationParams,0,0xa0);
  (this->super_ModuleBase).super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ProcessorBase_002f6f88;
  (this->super_ModuleBase).super_Scope._vptr_Scope = (_func_int **)&PTR__ProcessorBase_002f7040;
  (this->endpoints).
  super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->owningInstance).object = (ProcessorInstance *)0x0;
  (this->originalBeforeSpecialisation).object = (ProcessorBase *)0x0;
  if (pSVar4 != (Scope *)0x0) {
    return;
  }
  throwInternalCompilerError("getParentScope() != nullptr","ProcessorBase",0x2cd);
}

Assistant:

ProcessorBase (ObjectType ot, CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ModuleBase (ot, processorKeyword, processorName, moduleName)
        {
            SOUL_ASSERT (getParentScope() != nullptr);
        }